

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

ARKInterp arkInterpCreate_Lagrange(void *arkode_mem,int degree)

{
  ARKInterp __ptr;
  ARKInterpOps __ptr_00;
  int *piVar1;
  
  if (((uint)degree < 6 && arkode_mem != (void *)0x0) &&
     (__ptr = (ARKInterp)malloc(0x10), __ptr != (ARKInterp)0x0)) {
    __ptr_00 = (ARKInterpOps)malloc(0x38);
    if (__ptr_00 != (ARKInterpOps)0x0) {
      __ptr_00->resize = arkInterpResize_Lagrange;
      __ptr_00->free = arkInterpFree_Lagrange;
      __ptr_00->print = arkInterpPrintMem_Lagrange;
      __ptr_00->setdegree = arkInterpSetDegree_Lagrange;
      __ptr_00->init = arkInterpInit_Lagrange;
      __ptr_00->update = arkInterpUpdate_Lagrange;
      __ptr_00->evaluate = arkInterpEvaluate_Lagrange;
      piVar1 = (int *)calloc(1,0x28);
      if (piVar1 != (int *)0x0) {
        __ptr->ops = __ptr_00;
        __ptr->content = piVar1;
        *piVar1 = degree + 1;
        *(double *)(piVar1 + 8) = *(double *)((long)arkode_mem + 8) * 100.0;
        *(ulong *)((long)arkode_mem + 0x218) =
             *(long *)((long)arkode_mem + 0x218) + (ulong)(degree + 2);
        *(ulong *)((long)arkode_mem + 0x220) =
             *(long *)((long)arkode_mem + 0x220) + (ulong)(degree + 3);
        return __ptr;
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (ARKInterp)0x0;
}

Assistant:

ARKInterp arkInterpCreate_Lagrange(void* arkode_mem, int degree)
{
  ARKInterp interp;
  ARKInterpContent_Lagrange content;
  ARKInterpOps ops;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* check for valid degree */
  if (degree < 0 || degree > ARK_INTERP_MAX_DEGREE) return(NULL);

  /* allocate overall structure */
  interp = NULL;
  interp = (ARKInterp) malloc(sizeof *interp);
  if (interp == NULL)  return(NULL);

  /* allocate ops structure and set entries */
  ops = NULL;
  ops = (ARKInterpOps) malloc(sizeof *ops);
  if (ops == NULL) { free(interp); return(NULL); }
  ops->resize    = arkInterpResize_Lagrange;
  ops->free      = arkInterpFree_Lagrange;
  ops->print     = arkInterpPrintMem_Lagrange;
  ops->setdegree = arkInterpSetDegree_Lagrange;
  ops->init      = arkInterpInit_Lagrange;
  ops->update    = arkInterpUpdate_Lagrange;
  ops->evaluate  = arkInterpEvaluate_Lagrange;

  /* create content, and initialize everything to zero/NULL */
  content = NULL;
  content = (ARKInterpContent_Lagrange) malloc(sizeof *content);
  if (content == NULL) { free(ops); free(interp); return(NULL); }
  memset(content, 0, sizeof(struct _ARKInterpContent_Lagrange));

  /* attach ops and content structures to overall structure */
  interp->ops = ops;
  interp->content = content;

  /* fill content */

  /* maximum/current history length */
  content->nmax      = SUNMIN(degree+1, ARK_INTERP_MAX_DEGREE+1);  /* respect maximum possible */
  content->nmaxalloc = 0;
  content->nhist     = 0;

  /* initialize time/solution history arrays to NULL */
  content->thist = NULL;
  content->yhist = NULL;

  /* initial t roundoff value */
  content->tround = FUZZ_FACTOR*ark_mem->uround;

  /* update workspace sizes */
  ark_mem->lrw += content->nmax + 1;
  ark_mem->liw += content->nmax + 2;

  return(interp);
}